

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  GridSOA *pGVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  RTCFilterFunctionN p_Var8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar17;
  undefined4 uVar18;
  long lVar19;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar20;
  undefined4 uVar22;
  ulong uVar21;
  int iVar23;
  ulong uVar24;
  GridSOA *pGVar25;
  uint uVar26;
  undefined4 uVar27;
  GridSOA *pGVar28;
  GridSOA *extraout_RDX;
  GridSOA *extraout_RDX_00;
  GridSOA *extraout_RDX_01;
  GridSOA *extraout_RDX_02;
  ulong uVar29;
  long lVar30;
  GridSOA *pGVar31;
  Geometry *pGVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  float fVar40;
  float fVar71;
  float fVar72;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar73;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar68;
  undefined1 auVar69 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar70;
  uint uVar74;
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  uint uVar89;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar90;
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar96;
  float fVar103;
  float fVar105;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  uint uVar104;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar130;
  float fVar132;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar133;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar134;
  float fVar135;
  float fVar140;
  float fVar141;
  undefined1 auVar136 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar137;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar152;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar153;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  float fVar160;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined8 uStack_12d0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  vbool<4> valid;
  undefined1 local_1278 [16];
  Precalculations *local_1268;
  GridSOA *local_1260;
  ulong local_1258;
  GridSOA *local_1250;
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  undefined8 local_1228;
  float fStack_1220;
  float fStack_121c;
  undefined8 local_1218;
  float fStack_1210;
  float fStack_120c;
  RTCFilterFunctionNArguments args;
  undefined4 uStack_11bc;
  vfloat<4> tNear;
  float local_1158 [4];
  float local_1148 [4];
  float local_1138 [4];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined4 local_10a8;
  undefined4 uStack_10a4;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1068 [16];
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar113 [16];
  undefined1 auVar118 [16];
  float fVar131;
  
  pSVar20 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar130 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar72 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar173 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar169 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar172 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar189 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar199 = fVar169 * 0.99999964;
  fVar145 = fVar172 * 0.99999964;
  fVar193 = fVar189 * 0.99999964;
  fVar169 = fVar169 * 1.0000004;
  fVar172 = fVar172 * 1.0000004;
  fVar189 = fVar189 * 1.0000004;
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar23 = (tray->tnear).field_0.i[k];
  auVar51._4_4_ = iVar23;
  auVar51._0_4_ = iVar23;
  auVar51._8_4_ = iVar23;
  auVar51._12_4_ = iVar23;
  iVar23 = (tray->tfar).field_0.i[k];
  auVar126._4_4_ = iVar23;
  auVar126._0_4_ = iVar23;
  auVar126._8_4_ = iVar23;
  auVar126._12_4_ = iVar23;
  lVar19 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_10b8 = fVar145;
  fStack_10b4 = fVar145;
  fStack_10b0 = fVar145;
  fStack_10ac = fVar145;
  local_10c8 = auVar51;
  local_fa8 = fVar130;
  fStack_fa4 = fVar130;
  fStack_fa0 = fVar130;
  fStack_f9c = fVar130;
  local_fb8 = fVar72;
  fStack_fb4 = fVar72;
  fStack_fb0 = fVar72;
  fStack_fac = fVar72;
  local_fc8 = fVar173;
  fStack_fc4 = fVar173;
  fStack_fc0 = fVar173;
  fStack_fbc = fVar173;
  local_fd8 = fVar169;
  fStack_fd4 = fVar169;
  fStack_fd0 = fVar169;
  fStack_fcc = fVar169;
  local_fe8 = fVar172;
  fStack_fe4 = fVar172;
  fStack_fe0 = fVar172;
  fStack_fdc = fVar172;
  local_ff8 = fVar189;
  fStack_ff4 = fVar189;
  fStack_ff0 = fVar189;
  fStack_fec = fVar189;
  local_1008 = fVar193;
  fStack_1004 = fVar193;
  fStack_1000 = fVar193;
  fStack_ffc = fVar193;
  local_1018 = fVar199;
  fStack_1014 = fVar199;
  fStack_1010 = fVar199;
  fStack_100c = fVar199;
  fVar202 = fVar145;
  fVar194 = fVar145;
  fVar197 = fVar145;
  local_1268 = pre;
  fVar151 = fVar172;
  fVar144 = fVar172;
  fVar142 = fVar172;
  fVar141 = fVar173;
  fVar140 = fVar173;
  fVar135 = fVar173;
  fVar134 = fVar72;
  fVar132 = fVar72;
  fVar131 = fVar72;
  fVar122 = fVar199;
  fVar105 = fVar199;
  fVar103 = fVar199;
  fVar71 = fVar193;
  fVar40 = fVar193;
  fVar195 = fVar193;
  fVar90 = fVar189;
  fVar188 = fVar189;
  fVar185 = fVar189;
  fVar143 = fVar169;
  fVar133 = fVar169;
  fVar152 = fVar169;
  fVar73 = fVar130;
  fVar206 = fVar130;
  fVar198 = fVar130;
LAB_0028b1e1:
  do {
    pSVar17 = pSVar20 + -1;
    pSVar20 = pSVar20 + -1;
    if ((float)pSVar17->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar17->dist == *(float *)(ray + k * 4 + 0x80)) {
      pGVar28 = (GridSOA *)(pSVar20->ptr).ptr;
      while (((ulong)pGVar28 & 8) == 0) {
        pGVar31 = pGVar28 + uVar33 + 0x20;
        auVar41._0_4_ = (*(float *)pGVar31 - fVar198) * fVar103;
        auVar41._4_4_ = (*(float *)(pGVar31 + 4) - fVar206) * fVar105;
        auVar41._8_4_ = (*(float *)(pGVar31 + 8) - fVar73) * fVar122;
        auVar41._12_4_ = (*(float *)(pGVar31 + 0xc) - fVar130) * fVar199;
        pGVar31 = pGVar28 + uVar34 + 0x20;
        auVar177._0_4_ = (*(float *)pGVar31 - fVar131) * fVar145;
        auVar177._4_4_ = (*(float *)(pGVar31 + 4) - fVar132) * fVar202;
        auVar177._8_4_ = (*(float *)(pGVar31 + 8) - fVar134) * fVar194;
        auVar177._12_4_ = (*(float *)(pGVar31 + 0xc) - fVar72) * fVar197;
        auVar41 = maxps(auVar41,auVar177);
        pGVar31 = pGVar28 + uVar29 + 0x20;
        auVar180._0_4_ = (*(float *)pGVar31 - fVar135) * fVar195;
        auVar180._4_4_ = (*(float *)(pGVar31 + 4) - fVar140) * fVar40;
        auVar180._8_4_ = (*(float *)(pGVar31 + 8) - fVar141) * fVar71;
        auVar180._12_4_ = (*(float *)(pGVar31 + 0xc) - fVar173) * fVar193;
        auVar93 = maxps(auVar180,auVar51);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar41,auVar93);
        pGVar31 = pGVar28 + (uVar33 ^ 0x10) + 0x20;
        auVar94._0_4_ = (*(float *)pGVar31 - fVar198) * fVar152;
        auVar94._4_4_ = (*(float *)(pGVar31 + 4) - fVar206) * fVar133;
        auVar94._8_4_ = (*(float *)(pGVar31 + 8) - fVar73) * fVar143;
        auVar94._12_4_ = (*(float *)(pGVar31 + 0xc) - fVar130) * fVar169;
        pGVar31 = pGVar28 + (uVar34 ^ 0x10) + 0x20;
        auVar106._0_4_ = (*(float *)pGVar31 - fVar131) * fVar142;
        auVar106._4_4_ = (*(float *)(pGVar31 + 4) - fVar132) * fVar144;
        auVar106._8_4_ = (*(float *)(pGVar31 + 8) - fVar134) * fVar151;
        auVar106._12_4_ = (*(float *)(pGVar31 + 0xc) - fVar72) * fVar172;
        auVar41 = minps(auVar94,auVar106);
        pGVar31 = pGVar28 + (uVar29 ^ 0x10) + 0x20;
        auVar107._0_4_ = (*(float *)pGVar31 - fVar135) * fVar185;
        auVar107._4_4_ = (*(float *)(pGVar31 + 4) - fVar140) * fVar188;
        auVar107._8_4_ = (*(float *)(pGVar31 + 8) - fVar141) * fVar90;
        auVar107._12_4_ = (*(float *)(pGVar31 + 0xc) - fVar173) * fVar189;
        auVar93 = minps(auVar107,auVar126);
        auVar41 = minps(auVar41,auVar93);
        auVar93._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar41._4_4_);
        auVar93._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar41._0_4_);
        auVar93._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar41._8_4_);
        auVar93._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar41._12_4_);
        uVar26 = movmskps((int)root.ptr,auVar93);
        root.ptr = (size_t)uVar26;
        if (uVar26 == 0) {
          if (pSVar20 == stack) {
            return;
          }
          goto LAB_0028b1e1;
        }
        uVar24 = (ulong)pGVar28 & 0xfffffffffffffff0;
        lVar30 = 0;
        if ((byte)uVar26 != 0) {
          for (; ((byte)uVar26 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
          }
        }
        pGVar28 = *(GridSOA **)(uVar24 + lVar30 * 8);
        uVar26 = (uVar26 & 0xff) - 1 & uVar26 & 0xff;
        root.ptr = (size_t)pGVar28;
        if (uVar26 != 0) {
          uVar74 = tNear.field_0.i[lVar30];
          lVar30 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          root.ptr = *(ulong *)(uVar24 + lVar30 * 8);
          uVar89 = tNear.field_0.i[lVar30];
          uVar26 = uVar26 - 1 & uVar26;
          if (uVar26 == 0) {
            if (uVar74 < uVar89) {
              (pSVar20->ptr).ptr = root.ptr;
              pSVar20->dist = uVar89;
              pSVar20 = pSVar20 + 1;
              root.ptr = (size_t)pGVar28;
            }
            else {
              (pSVar20->ptr).ptr = (size_t)pGVar28;
              pSVar20->dist = uVar74;
              pSVar20 = pSVar20 + 1;
              pGVar28 = (GridSOA *)root.ptr;
            }
          }
          else {
            auVar95._8_4_ = uVar74;
            auVar95._0_8_ = pGVar28;
            auVar95._12_4_ = 0;
            auVar123._8_4_ = uVar89;
            auVar123._0_8_ = root.ptr;
            auVar123._12_4_ = 0;
            lVar30 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            uVar7 = *(undefined8 *)(uVar24 + lVar30 * 8);
            iVar23 = tNear.field_0.i[lVar30];
            auVar108._8_4_ = iVar23;
            auVar108._0_8_ = uVar7;
            auVar108._12_4_ = 0;
            auVar42._8_4_ = -(uint)((int)uVar74 < (int)uVar89);
            uVar26 = uVar26 - 1 & uVar26;
            if (uVar26 == 0) {
              auVar42._4_4_ = auVar42._8_4_;
              auVar42._0_4_ = auVar42._8_4_;
              auVar42._12_4_ = auVar42._8_4_;
              auVar136._8_4_ = uVar89;
              auVar136._0_8_ = root.ptr;
              auVar136._12_4_ = 0;
              auVar177 = blendvps(auVar136,auVar95,auVar42);
              auVar41 = blendvps(auVar95,auVar123,auVar42);
              auVar43._8_4_ = -(uint)(auVar177._8_4_ < iVar23);
              auVar43._4_4_ = auVar43._8_4_;
              auVar43._0_4_ = auVar43._8_4_;
              auVar43._12_4_ = auVar43._8_4_;
              auVar124._8_4_ = iVar23;
              auVar124._0_8_ = uVar7;
              auVar124._12_4_ = 0;
              auVar93 = blendvps(auVar124,auVar177,auVar43);
              auVar177 = blendvps(auVar177,auVar108,auVar43);
              auVar44._8_4_ = -(uint)(auVar41._8_4_ < auVar177._8_4_);
              auVar44._4_4_ = auVar44._8_4_;
              auVar44._0_4_ = auVar44._8_4_;
              auVar44._12_4_ = auVar44._8_4_;
              SVar109 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar177,auVar41,auVar44);
              SVar96 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar41,auVar177,auVar44);
              *pSVar20 = SVar96;
              pSVar20[1] = SVar109;
              pGVar28 = auVar93._0_8_;
              pSVar20 = pSVar20 + 2;
              root.ptr = (size_t)pGVar28;
            }
            else {
              lVar30 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              auVar45._4_4_ = auVar42._8_4_;
              auVar45._0_4_ = auVar42._8_4_;
              auVar45._8_4_ = auVar42._8_4_;
              auVar45._12_4_ = auVar42._8_4_;
              auVar177 = blendvps(auVar123,auVar95,auVar45);
              auVar51 = blendvps(auVar95,auVar123,auVar45);
              auVar146._8_4_ = tNear.field_0.i[lVar30];
              auVar146._0_8_ = *(undefined8 *)(uVar24 + lVar30 * 8);
              auVar146._12_4_ = 0;
              auVar46._8_4_ = -(uint)(iVar23 < tNear.field_0.i[lVar30]);
              auVar46._4_4_ = auVar46._8_4_;
              auVar46._0_4_ = auVar46._8_4_;
              auVar46._12_4_ = auVar46._8_4_;
              auVar93 = blendvps(auVar146,auVar108,auVar46);
              auVar41 = blendvps(auVar108,auVar146,auVar46);
              auVar47._8_4_ = -(uint)(auVar51._8_4_ < auVar41._8_4_);
              auVar47._4_4_ = auVar47._8_4_;
              auVar47._0_4_ = auVar47._8_4_;
              auVar47._12_4_ = auVar47._8_4_;
              auVar180 = blendvps(auVar41,auVar51,auVar47);
              SVar96 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar51,auVar41,auVar47);
              auVar48._8_4_ = -(uint)(auVar177._8_4_ < auVar93._8_4_);
              auVar48._4_4_ = auVar48._8_4_;
              auVar48._0_4_ = auVar48._8_4_;
              auVar48._12_4_ = auVar48._8_4_;
              auVar51 = blendvps(auVar93,auVar177,auVar48);
              auVar41 = blendvps(auVar177,auVar93,auVar48);
              auVar49._8_4_ = -(uint)(auVar41._8_4_ < auVar180._8_4_);
              auVar49._4_4_ = auVar49._8_4_;
              auVar49._0_4_ = auVar49._8_4_;
              auVar49._12_4_ = auVar49._8_4_;
              SVar109 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar180,auVar41,auVar49);
              SVar137 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar41,auVar180,auVar49);
              *pSVar20 = SVar96;
              pSVar20[1] = SVar137;
              pSVar20[2] = SVar109;
              pGVar28 = auVar51._0_8_;
              pSVar20 = pSVar20 + 3;
              root.ptr = (size_t)pGVar28;
              auVar51 = local_10c8;
              fVar145 = local_10b8;
              fVar202 = fStack_10b4;
              fVar194 = fStack_10b0;
              fVar197 = fStack_10ac;
            }
          }
        }
      }
      if (((uint)pGVar28 & 0xf) == 8) {
        pGVar25 = (local_1268->super_Precalculations).grid;
        uVar24 = (ulong)*(uint *)(pGVar25 + 0xc);
        uVar21 = (ulong)*(uint *)(pGVar25 + 0x14);
        local_1228 = pGVar25 + ((ulong)pGVar28 >> 4) * 4 + (ulong)*(uint *)(pGVar25 + 0x24);
        pGVar31 = local_1228 + uVar21 * 4 + 0x2c;
        pGVar3 = local_1228 + uVar21 * 8 + 0x2c;
        pGVar28 = pGVar25 + ((ulong)pGVar28 >> 4) * 4 + (ulong)*(uint *)(pGVar25 + 0x24) + 0x2c;
        fVar130 = *(float *)(pGVar28 + 4);
        pGVar4 = local_1228 + uVar24 * 4 + 0x2c;
        fVar72 = *(float *)(pGVar4 + 4);
        if (uVar24 == 2) {
          fVar173 = *(float *)pGVar31;
          fVar169 = *(float *)(local_1228 + uVar21 * 4 + 0x30);
          fVar172 = *(float *)(local_1228 + uVar21 * 4 + 0x34);
          fVar189 = *(float *)(local_1228 + uVar21 * 4 + 0x38);
          fVar145 = *(float *)pGVar3;
          fVar202 = *(float *)(pGVar3 + 4);
          fVar194 = *(float *)(pGVar3 + 8);
          fVar197 = *(float *)(pGVar3 + 0xc);
          fVar198 = fVar197;
          fVar206 = fVar202;
          fVar73 = fVar72;
          fVar152 = fVar189;
          fVar133 = fVar130;
          fVar143 = fVar169;
        }
        else {
          fVar173 = *(float *)pGVar31;
          fVar169 = *(float *)(local_1228 + uVar21 * 4 + 0x30);
          pGVar31 = pGVar31 + uVar24 * 4;
          fVar172 = *(float *)pGVar31;
          fVar189 = *(float *)(pGVar31 + 4);
          fVar145 = *(float *)pGVar3;
          fVar202 = *(float *)(pGVar3 + 4);
          pGVar1 = pGVar3 + uVar24 * 4;
          fVar194 = *(float *)pGVar1;
          fVar197 = *(float *)(pGVar1 + 4);
          fVar198 = *(float *)(pGVar1 + 8);
          fVar206 = *(float *)(pGVar3 + 8);
          fVar73 = *(float *)(pGVar4 + 8);
          fVar152 = *(float *)(pGVar31 + 8);
          fVar133 = *(float *)(pGVar28 + 8);
          fVar143 = *(float *)(local_1228 + uVar21 * 4 + 0x34);
        }
        local_1250 = (GridSOA *)(ulong)*(uint *)(pGVar25 + 0x10);
        local_1260 = local_1228 + uVar21 * 0xc + 0x2c;
        fVar185 = *(float *)(ray + k * 4);
        fVar188 = *(float *)(ray + k * 4 + 0x10);
        fVar90 = *(float *)(ray + k * 4 + 0x20);
        fVar195 = *(float *)(ray + k * 4 + 0x40);
        local_10d8._0_4_ = *(float *)pGVar28 - fVar185;
        local_10d8._4_4_ = *(float *)pGVar4 - fVar185;
        fStack_10d0 = fVar130 - fVar185;
        fStack_10cc = fVar72 - fVar185;
        fVar173 = fVar173 - fVar188;
        fVar181 = fVar172 - fVar188;
        fVar183 = fVar169 - fVar188;
        fVar186 = fVar189 - fVar188;
        fVar145 = fVar145 - fVar90;
        fVar190 = fVar194 - fVar90;
        fVar191 = fVar202 - fVar90;
        fVar192 = fVar197 - fVar90;
        fVar122 = fVar130 - fVar185;
        fVar130 = fVar130 - fVar185;
        fVar132 = fVar133 - fVar185;
        fVar133 = fVar133 - fVar185;
        fVar134 = fVar169 - fVar188;
        fVar169 = fVar169 - fVar188;
        fVar141 = fVar143 - fVar188;
        fVar143 = fVar143 - fVar188;
        fVar200 = fVar202 - fVar90;
        fVar202 = fVar202 - fVar90;
        fVar204 = fVar206 - fVar90;
        fVar206 = fVar206 - fVar90;
        fVar40 = *(float *)pGVar4 - fVar185;
        fVar71 = fVar72 - fVar185;
        fVar72 = fVar72 - fVar185;
        fVar73 = fVar73 - fVar185;
        fVar172 = fVar172 - fVar188;
        fVar151 = fVar189 - fVar188;
        fVar189 = fVar189 - fVar188;
        fVar152 = fVar152 - fVar188;
        fVar194 = fVar194 - fVar90;
        fVar196 = fVar197 - fVar90;
        fVar197 = fVar197 - fVar90;
        fVar198 = fVar198 - fVar90;
        fVar159 = fVar40 - (float)local_10d8._0_4_;
        fVar163 = fVar71 - (float)local_10d8._4_4_;
        fVar165 = fVar72 - fStack_10d0;
        fVar167 = fVar73 - fStack_10cc;
        fVar90 = fVar172 - fVar173;
        fVar193 = fVar151 - fVar181;
        fVar103 = fVar189 - fVar183;
        fVar105 = fVar152 - fVar186;
        fVar170 = fVar194 - fVar145;
        fVar171 = fVar196 - fVar190;
        fStack_1240 = fVar197 - fVar191;
        fStack_123c = fVar198 - fVar192;
        fVar185 = *(float *)(ray + k * 4 + 0x50);
        fVar188 = *(float *)(ray + k * 4 + 0x60);
        fVar153 = (float)local_10d8._0_4_ - fVar122;
        fVar156 = (float)local_10d8._4_4_ - fVar130;
        fVar157 = fStack_10d0 - fVar132;
        fVar158 = fStack_10cc - fVar133;
        fVar199 = (fVar90 * (fVar194 + fVar145) - (fVar172 + fVar173) * fVar170) * fVar195 +
                  ((fVar40 + (float)local_10d8._0_4_) * fVar170 - (fVar194 + fVar145) * fVar159) *
                  fVar185 + (fVar159 * (fVar172 + fVar173) -
                            (fVar40 + (float)local_10d8._0_4_) * fVar90) * fVar188;
        fVar131 = (fVar193 * (fVar196 + fVar190) - (fVar151 + fVar181) * fVar171) * fVar195 +
                  ((fVar71 + (float)local_10d8._4_4_) * fVar171 - (fVar196 + fVar190) * fVar163) *
                  fVar185 + (fVar163 * (fVar151 + fVar181) -
                            (fVar71 + (float)local_10d8._4_4_) * fVar193) * fVar188;
        auVar125._0_8_ = CONCAT44(fVar131,fVar199);
        auVar125._8_4_ =
             (fVar103 * (fVar197 + fVar191) - (fVar189 + fVar183) * fStack_1240) * fVar195 +
             ((fVar72 + fStack_10d0) * fStack_1240 - (fVar197 + fVar191) * fVar165) * fVar185 +
             (fVar165 * (fVar189 + fVar183) - (fVar72 + fStack_10d0) * fVar103) * fVar188;
        auVar125._12_4_ =
             (fVar105 * (fVar198 + fVar192) - (fVar152 + fVar186) * fStack_123c) * fVar195 +
             ((fVar73 + fStack_10cc) * fStack_123c - (fVar198 + fVar192) * fVar167) * fVar185 +
             (fVar167 * (fVar152 + fVar186) - (fVar73 + fStack_10cc) * fVar105) * fVar188;
        fVar160 = fVar173 - fVar134;
        fVar164 = fVar181 - fVar169;
        fVar166 = fVar183 - fVar141;
        fVar168 = fVar186 - fVar143;
        local_10e8 = fVar145 - fVar200;
        fStack_10e4 = fVar190 - fVar202;
        fStack_10e0 = fVar191 - fVar204;
        fStack_10dc = fVar192 - fVar206;
        local_10f8._0_4_ =
             (fVar160 * (fVar145 + fVar200) - (fVar173 + fVar134) * local_10e8) * fVar195 +
             (((float)local_10d8._0_4_ + fVar122) * local_10e8 - (fVar145 + fVar200) * fVar153) *
             fVar185 + (fVar153 * (fVar173 + fVar134) -
                       ((float)local_10d8._0_4_ + fVar122) * fVar160) * fVar188;
        local_10f8._4_4_ =
             (fVar164 * (fVar190 + fVar202) - (fVar181 + fVar169) * fStack_10e4) * fVar195 +
             (((float)local_10d8._4_4_ + fVar130) * fStack_10e4 - (fVar190 + fVar202) * fVar156) *
             fVar185 + (fVar156 * (fVar181 + fVar169) -
                       ((float)local_10d8._4_4_ + fVar130) * fVar164) * fVar188;
        fStack_10f0 = (fVar166 * (fVar191 + fVar204) - (fVar183 + fVar141) * fStack_10e0) * fVar195
                      + ((fStack_10d0 + fVar132) * fStack_10e0 - (fVar191 + fVar204) * fVar157) *
                        fVar185 + (fVar157 * (fVar183 + fVar141) - (fStack_10d0 + fVar132) * fVar166
                                  ) * fVar188;
        fStack_10ec = (fVar168 * (fVar192 + fVar206) - (fVar186 + fVar143) * fStack_10dc) * fVar195
                      + ((fStack_10cc + fVar133) * fStack_10dc - (fVar192 + fVar206) * fVar158) *
                        fVar185 + (fVar158 * (fVar186 + fVar143) - (fStack_10cc + fVar133) * fVar168
                                  ) * fVar188;
        fVar174 = fVar122 - fVar40;
        fVar182 = fVar130 - fVar71;
        fVar184 = fVar132 - fVar72;
        fVar187 = fVar133 - fVar73;
        fVar135 = fVar134 - fVar172;
        fVar140 = fVar169 - fVar151;
        auVar16._4_4_ = fVar140;
        auVar16._0_4_ = fVar135;
        fVar142 = fVar141 - fVar189;
        fVar144 = fVar143 - fVar152;
        fVar201 = fVar200 - fVar194;
        fVar203 = fVar202 - fVar196;
        fVar205 = fVar204 - fVar197;
        fVar207 = fVar206 - fVar198;
        auVar77._0_4_ =
             (fVar135 * (fVar194 + fVar200) - (fVar172 + fVar134) * fVar201) * fVar195 +
             ((fVar40 + fVar122) * fVar201 - (fVar194 + fVar200) * fVar174) * fVar185 +
             (fVar174 * (fVar172 + fVar134) - (fVar40 + fVar122) * fVar135) * fVar188;
        auVar77._4_4_ =
             (fVar140 * (fVar196 + fVar202) - (fVar151 + fVar169) * fVar203) * fVar195 +
             ((fVar71 + fVar130) * fVar203 - (fVar196 + fVar202) * fVar182) * fVar185 +
             (fVar182 * (fVar151 + fVar169) - (fVar71 + fVar130) * fVar140) * fVar188;
        auVar77._8_4_ =
             (fVar142 * (fVar197 + fVar204) - (fVar189 + fVar141) * fVar205) * fVar195 +
             ((fVar72 + fVar132) * fVar205 - (fVar197 + fVar204) * fVar184) * fVar185 +
             (fVar184 * (fVar189 + fVar141) - (fVar72 + fVar132) * fVar142) * fVar188;
        auVar77._12_4_ =
             (fVar144 * (fVar198 + fVar206) - (fVar152 + fVar143) * fVar207) * fVar195 +
             ((fVar73 + fVar133) * fVar207 - (fVar198 + fVar206) * fVar187) * fVar185 +
             (fVar187 * (fVar152 + fVar143) - (fVar73 + fVar133) * fVar144) * fVar188;
        auVar97._0_4_ = fVar199 + (float)local_10f8._0_4_ + auVar77._0_4_;
        auVar97._4_4_ = fVar131 + (float)local_10f8._4_4_ + auVar77._4_4_;
        auVar97._8_4_ = auVar125._8_4_ + fStack_10f0 + auVar77._8_4_;
        auVar97._12_4_ = auVar125._12_4_ + fStack_10ec + auVar77._12_4_;
        auVar50._8_4_ = auVar125._8_4_;
        auVar50._0_8_ = auVar125._0_8_;
        auVar50._12_4_ = auVar125._12_4_;
        auVar51 = minps(auVar50,_local_10f8);
        auVar51 = minps(auVar51,auVar77);
        auVar126 = maxps(auVar125,_local_10f8);
        auVar126 = maxps(auVar126,auVar77);
        local_f98 = ABS(auVar97._0_4_);
        fStack_f94 = ABS(auVar97._4_4_);
        fStack_f90 = ABS(auVar97._8_4_);
        fStack_f8c = ABS(auVar97._12_4_);
        auVar127._4_4_ = -(uint)(auVar126._4_4_ <= fStack_f94 * 1.1920929e-07);
        auVar127._0_4_ = -(uint)(auVar126._0_4_ <= local_f98 * 1.1920929e-07);
        auVar127._8_4_ = -(uint)(auVar126._8_4_ <= fStack_f90 * 1.1920929e-07);
        auVar127._12_4_ = -(uint)(auVar126._12_4_ <= fStack_f8c * 1.1920929e-07);
        auVar52._4_4_ = -(uint)(-(fStack_f94 * 1.1920929e-07) <= auVar51._4_4_);
        auVar52._0_4_ = -(uint)(-(local_f98 * 1.1920929e-07) <= auVar51._0_4_);
        auVar52._8_4_ = -(uint)(-(fStack_f90 * 1.1920929e-07) <= auVar51._8_4_);
        auVar52._12_4_ = -(uint)(-(fStack_f8c * 1.1920929e-07) <= auVar51._12_4_);
        auVar127 = auVar127 | auVar52;
        iVar23 = movmskps((int)local_1260,auVar127);
        uVar18 = SUB84(ray,0);
        uVar22 = (undefined4)((ulong)ray >> 0x20);
        root.ptr = (size_t)local_1250;
        local_1218 = local_1250;
        if (iVar23 != 0) {
          auVar16._8_4_ = fVar142;
          auVar16._12_4_ = fVar144;
          local_f88 = auVar16;
          auVar149._0_4_ = fVar90 * local_10e8 - fVar160 * fVar170;
          auVar149._4_4_ = fVar193 * fStack_10e4 - fVar164 * fVar171;
          auVar149._8_4_ = fVar103 * fStack_10e0 - fVar166 * fStack_1240;
          auVar149._12_4_ = fVar105 * fStack_10dc - fVar168 * fStack_123c;
          auVar161._0_4_ = fVar160 * fVar201 - fVar135 * local_10e8;
          auVar161._4_4_ = fVar164 * fVar203 - fVar140 * fStack_10e4;
          auVar161._8_4_ = fVar166 * fVar205 - fVar142 * fStack_10e0;
          auVar161._12_4_ = fVar168 * fVar207 - fVar144 * fStack_10dc;
          auVar53._4_4_ = -(uint)(ABS(fVar164 * fVar171) < ABS(fVar140 * fStack_10e4));
          auVar53._0_4_ = -(uint)(ABS(fVar160 * fVar170) < ABS(fVar135 * local_10e8));
          auVar53._8_4_ = -(uint)(ABS(fVar166 * fStack_1240) < ABS(fVar142 * fStack_10e0));
          auVar53._12_4_ = -(uint)(ABS(fVar168 * fStack_123c) < ABS(fVar144 * fStack_10dc));
          local_1128 = blendvps(auVar161,auVar149,auVar53);
          auVar175._0_4_ = fVar174 * local_10e8 - fVar153 * fVar201;
          auVar175._4_4_ = fVar182 * fStack_10e4 - fVar156 * fVar203;
          auVar175._8_4_ = fVar184 * fStack_10e0 - fVar157 * fVar205;
          auVar175._12_4_ = fVar187 * fStack_10dc - fVar158 * fVar207;
          auVar54._4_4_ = -(uint)(ABS(fVar163 * fStack_10e4) < ABS(fVar156 * fVar203));
          auVar54._0_4_ = -(uint)(ABS(fVar159 * local_10e8) < ABS(fVar153 * fVar201));
          auVar54._8_4_ = -(uint)(ABS(fVar165 * fStack_10e0) < ABS(fVar157 * fVar205));
          auVar54._12_4_ = -(uint)(ABS(fVar167 * fStack_10dc) < ABS(fVar158 * fVar207));
          auVar10._4_4_ = fVar171 * fVar156 - fVar163 * fStack_10e4;
          auVar10._0_4_ = fVar170 * fVar153 - fVar159 * local_10e8;
          auVar10._8_4_ = fStack_1240 * fVar157 - fVar165 * fStack_10e0;
          auVar10._12_4_ = fStack_123c * fVar158 - fVar167 * fStack_10dc;
          local_1118 = blendvps(auVar175,auVar10,auVar54);
          auVar138._0_4_ = fVar159 * fVar160 - fVar153 * fVar90;
          auVar138._4_4_ = fVar163 * fVar164 - fVar156 * fVar193;
          auVar138._8_4_ = fVar165 * fVar166 - fVar157 * fVar103;
          auVar138._12_4_ = fVar167 * fVar168 - fVar158 * fVar105;
          auVar154._0_4_ = fVar153 * fVar135 - fVar174 * fVar160;
          auVar154._4_4_ = fVar156 * fVar140 - fVar182 * fVar164;
          auVar154._8_4_ = fVar157 * fVar142 - fVar184 * fVar166;
          auVar154._12_4_ = fVar158 * fVar144 - fVar187 * fVar168;
          auVar55._4_4_ = -(uint)(ABS(fVar156 * fVar193) < ABS(fVar182 * fVar164));
          auVar55._0_4_ = -(uint)(ABS(fVar153 * fVar90) < ABS(fVar174 * fVar160));
          auVar55._8_4_ = -(uint)(ABS(fVar157 * fVar103) < ABS(fVar184 * fVar166));
          auVar55._12_4_ = -(uint)(ABS(fVar158 * fVar105) < ABS(fVar187 * fVar168));
          local_1108 = blendvps(auVar154,auVar138,auVar55);
          fVar130 = fVar195 * local_1128._0_4_ +
                    fVar185 * local_1118._0_4_ + fVar188 * local_1108._0_4_;
          fVar72 = fVar195 * local_1128._4_4_ +
                   fVar185 * local_1118._4_4_ + fVar188 * local_1108._4_4_;
          fVar169 = fVar195 * local_1128._8_4_ +
                    fVar185 * local_1118._8_4_ + fVar188 * local_1108._8_4_;
          fVar172 = fVar195 * local_1128._12_4_ +
                    fVar185 * local_1118._12_4_ + fVar188 * local_1108._12_4_;
          auVar110._0_4_ = fVar130 + fVar130;
          auVar110._4_4_ = fVar72 + fVar72;
          auVar110._8_4_ = fVar169 + fVar169;
          auVar110._12_4_ = fVar172 + fVar172;
          auVar56._0_4_ = fVar173 * local_1118._0_4_ + fVar145 * local_1108._0_4_;
          auVar56._4_4_ = fVar181 * local_1118._4_4_ + fVar190 * local_1108._4_4_;
          auVar56._8_4_ = fVar183 * local_1118._8_4_ + fVar191 * local_1108._8_4_;
          auVar56._12_4_ = fVar186 * local_1118._12_4_ + fVar192 * local_1108._12_4_;
          fVar173 = (float)local_10d8._0_4_ * local_1128._0_4_ + auVar56._0_4_;
          fVar169 = (float)local_10d8._4_4_ * local_1128._4_4_ + auVar56._4_4_;
          fVar145 = fStack_10d0 * local_1128._8_4_ + auVar56._8_4_;
          fVar202 = fStack_10cc * local_1128._12_4_ + auVar56._12_4_;
          auVar51 = rcpps(auVar56,auVar110);
          fVar130 = auVar51._0_4_;
          fVar72 = auVar51._4_4_;
          fVar172 = auVar51._8_4_;
          fVar189 = auVar51._12_4_;
          fVar173 = ((1.0 - auVar110._0_4_ * fVar130) * fVar130 + fVar130) * (fVar173 + fVar173);
          fVar169 = ((1.0 - auVar110._4_4_ * fVar72) * fVar72 + fVar72) * (fVar169 + fVar169);
          fVar172 = ((1.0 - auVar110._8_4_ * fVar172) * fVar172 + fVar172) * (fVar145 + fVar145);
          fVar189 = ((1.0 - auVar110._12_4_ * fVar189) * fVar189 + fVar189) * (fVar202 + fVar202);
          fVar72 = *(float *)(ray + k * 4 + 0x80);
          fVar130 = *(float *)(ray + k * 4 + 0x30);
          auVar57._0_4_ = -(uint)(fVar173 <= fVar72 && fVar130 <= fVar173) & auVar127._0_4_;
          auVar57._4_4_ = -(uint)(fVar169 <= fVar72 && fVar130 <= fVar169) & auVar127._4_4_;
          auVar57._8_4_ = -(uint)(fVar172 <= fVar72 && fVar130 <= fVar172) & auVar127._8_4_;
          auVar57._12_4_ = -(uint)(fVar189 <= fVar72 && fVar130 <= fVar189) & auVar127._12_4_;
          iVar23 = movmskps(iVar23,auVar57);
          if (iVar23 != 0) {
            auVar111._4_4_ = -(uint)(auVar110._4_4_ != 0.0);
            auVar111._0_4_ = -(uint)(auVar110._0_4_ != 0.0);
            auVar111._8_4_ = -(uint)(auVar110._8_4_ != 0.0);
            auVar111._12_4_ = -(uint)(auVar110._12_4_ != 0.0);
            valid.field_0.i[0] = auVar57._0_4_ & -(uint)(auVar110._0_4_ != 0.0);
            valid.field_0.i[1] = auVar57._4_4_ & -(uint)(auVar110._4_4_ != 0.0);
            valid.field_0.i[2] = auVar57._8_4_ & -(uint)(auVar110._8_4_ != 0.0);
            valid.field_0.i[3] = auVar57._12_4_ & -(uint)(auVar110._12_4_ != 0.0);
            iVar23 = movmskps(iVar23,(undefined1  [16])valid.field_0);
            if (iVar23 != 0) {
              uVar26 = *(uint *)(pGVar25 + 0x18);
              uStack_12a0._0_4_ = *(undefined4 *)(pGVar25 + 0x1c);
              uStack_12b0 = auVar125._8_8_;
              tNear.field_0._8_8_ = uStack_12b0;
              tNear.field_0._0_8_ = auVar125._0_8_;
              local_1138[0] = fVar173;
              local_1138[1] = fVar169;
              local_1138[2] = fVar172;
              local_1138[3] = fVar189;
              pGVar32 = (context->scene->geometries).items[uVar26].ptr;
              root.ptr = (size_t)(ulong)*(uint *)(ray + k * 4 + 0x90);
              if ((pGVar32->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar51 = *(undefined1 (*) [16])local_1260;
                auVar91 = auVar51._0_12_;
                auVar126 = *(undefined1 (*) [16])(local_1260 + uVar24 * 4);
                auVar75 = auVar126._0_12_;
                if (uVar24 == 2) {
                  auVar91._0_8_ = auVar51._0_8_;
                  auVar91._8_4_ = auVar51._4_4_;
                  auVar75._0_8_ = auVar126._0_8_;
                  auVar75._8_4_ = auVar126._4_4_;
                }
                auVar51 = rcpps(auVar111,auVar97);
                fVar130 = auVar51._0_4_;
                fVar145 = auVar51._4_4_;
                fVar202 = auVar51._8_4_;
                fVar194 = auVar51._12_4_;
                fVar130 = (float)(-(uint)(1e-18 <= local_f98) &
                                 (uint)(((float)DAT_01f7ba10 - auVar97._0_4_ * fVar130) * fVar130 +
                                       fVar130));
                fVar145 = (float)(-(uint)(1e-18 <= fStack_f94) &
                                 (uint)((DAT_01f7ba10._4_4_ - auVar97._4_4_ * fVar145) * fVar145 +
                                       fVar145));
                fVar202 = (float)(-(uint)(1e-18 <= fStack_f90) &
                                 (uint)((DAT_01f7ba10._8_4_ - auVar97._8_4_ * fVar202) * fVar202 +
                                       fVar202));
                fVar194 = (float)(-(uint)(1e-18 <= fStack_f8c) &
                                 (uint)((DAT_01f7ba10._12_4_ - auVar97._12_4_ * fVar194) * fVar194 +
                                       fVar194));
                auVar176._0_4_ = fVar199 * fVar130;
                auVar176._4_4_ = fVar131 * fVar145;
                auVar176._8_4_ = auVar125._8_4_ * fVar202;
                auVar176._12_4_ = auVar125._12_4_ * fVar194;
                auVar177 = minps(auVar176,_DAT_01f7ba10);
                auVar147._0_4_ = (float)local_10f8._0_4_ * fVar130;
                auVar147._4_4_ = (float)local_10f8._4_4_ * fVar145;
                auVar147._8_4_ = fStack_10f0 * fVar202;
                auVar147._12_4_ = fStack_10ec * fVar194;
                auVar93 = minps(auVar147,_DAT_01f7ba10);
                auVar98._4_4_ = auVar91._4_4_;
                auVar113._0_8_ = auVar91._0_8_;
                auVar98._8_4_ = auVar91._8_4_;
                auVar113._8_4_ = auVar98._4_4_;
                uVar89 = auVar75._4_4_;
                auVar113._12_4_ = uVar89;
                uVar74 = auVar75._0_4_;
                auVar112._8_8_ = auVar113._8_8_;
                auVar112._0_4_ = auVar91._0_4_;
                auVar112._4_4_ = uVar74;
                auVar98._0_4_ = auVar98._4_4_;
                auVar98._12_4_ = auVar98._8_4_;
                auVar78._0_8_ = auVar75._0_8_;
                auVar78._8_4_ = uVar89;
                auVar78._12_4_ = auVar75._8_4_;
                auVar51 = ZEXT816(0);
                auVar41 = pblendw(auVar112,auVar51,0xaa);
                auVar126 = pblendw(auVar98,auVar51,0xaa);
                auVar51 = pblendw(auVar78,auVar51,0xaa);
                fVar152 = auVar177._0_4_;
                fVar133 = auVar177._4_4_;
                fVar143 = auVar177._8_4_;
                fVar185 = auVar177._12_4_;
                fVar197 = auVar93._0_4_;
                fVar198 = auVar93._4_4_;
                fVar206 = auVar93._8_4_;
                fVar73 = auVar93._12_4_;
                fVar130 = ((float)DAT_01f7ba10 - fVar152) - fVar197;
                fVar145 = (DAT_01f7ba10._4_4_ - fVar133) - fVar198;
                fVar202 = (DAT_01f7ba10._8_4_ - fVar143) - fVar206;
                fVar194 = (DAT_01f7ba10._12_4_ - fVar185) - fVar73;
                local_1158[0] =
                     (float)auVar41._0_4_ * 0.00012207031 * fVar130 +
                     (float)auVar51._0_4_ * 0.00012207031 * fVar197 +
                     (float)auVar126._0_4_ * 0.00012207031 * fVar152;
                local_1158[1] =
                     (float)auVar41._4_4_ * 0.00012207031 * fVar145 +
                     (float)auVar51._4_4_ * 0.00012207031 * fVar198 +
                     (float)auVar126._4_4_ * 0.00012207031 * fVar133;
                local_1158[2] =
                     (float)auVar41._8_4_ * 0.00012207031 * fVar202 +
                     (float)auVar51._8_4_ * 0.00012207031 * fVar206 +
                     (float)auVar126._8_4_ * 0.00012207031 * fVar143;
                local_1158[3] =
                     (float)auVar41._12_4_ * 0.00012207031 * fVar194 +
                     (float)auVar51._12_4_ * 0.00012207031 * fVar73 +
                     (float)auVar126._12_4_ * 0.00012207031 * fVar185;
                local_1148[0] =
                     fVar130 * (float)(auVar112._0_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar74 >> 0x10) * 0.00012207031 * fVar197 +
                     (float)(auVar98._4_4_ >> 0x10) * 0.00012207031 * fVar152;
                local_1148[1] =
                     fVar145 * (float)(uVar74 >> 0x10) * 0.00012207031 +
                     (float)(uVar89 >> 0x10) * 0.00012207031 * fVar198 +
                     (float)(auVar98._4_4_ >> 0x10) * 0.00012207031 * fVar133;
                local_1148[2] =
                     fVar202 * (float)(auVar98._4_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar89 >> 0x10) * 0.00012207031 * fVar206 +
                     (float)(auVar98._8_4_ >> 0x10) * 0.00012207031 * fVar143;
                local_1148[3] =
                     fVar194 * (float)(uVar89 >> 0x10) * 0.00012207031 +
                     (float)(auVar75._8_4_ >> 0x10) * 0.00012207031 * fVar73 +
                     (float)(auVar98._8_4_ >> 0x10) * 0.00012207031 * fVar185;
                auVar12._4_4_ = fVar169;
                auVar12._0_4_ = fVar173;
                auVar12._8_4_ = fVar172;
                auVar12._12_4_ = fVar189;
                auVar126 = blendvps(_DAT_01f7a9f0,auVar12,(undefined1  [16])valid.field_0);
                auVar114._4_4_ = auVar126._0_4_;
                auVar114._0_4_ = auVar126._4_4_;
                auVar114._8_4_ = auVar126._12_4_;
                auVar114._12_4_ = auVar126._8_4_;
                auVar51 = minps(auVar114,auVar126);
                auVar79._0_8_ = auVar51._8_8_;
                auVar79._8_4_ = auVar51._0_4_;
                auVar79._12_4_ = auVar51._4_4_;
                auVar51 = minps(auVar79,auVar51);
                uVar35 = -(uint)(auVar51._0_4_ == auVar126._0_4_);
                uVar37 = -(uint)(auVar51._4_4_ == auVar126._4_4_);
                uVar38 = -(uint)(auVar51._8_4_ == auVar126._8_4_);
                uVar39 = -(uint)(auVar51._12_4_ == auVar126._12_4_);
                auVar99._0_4_ = uVar35 & valid.field_0.i[0];
                auVar99._4_4_ = uVar37 & valid.field_0.i[1];
                auVar99._8_4_ = uVar38 & valid.field_0.i[2];
                auVar99._12_4_ = uVar39 & valid.field_0.i[3];
                iVar23 = movmskps((int)local_1260,auVar99);
                uVar74 = 0xffffffff;
                uVar89 = 0xffffffff;
                uVar104 = 0xffffffff;
                uVar36 = 0xffffffff;
                if (iVar23 != 0) {
                  uVar74 = uVar35;
                  uVar89 = uVar37;
                  uVar104 = uVar38;
                  uVar36 = uVar39;
                }
                auVar58._0_4_ = valid.field_0.i[0] & uVar74;
                auVar58._4_4_ = valid.field_0.i[1] & uVar89;
                auVar58._8_4_ = valid.field_0.i[2] & uVar104;
                auVar58._12_4_ = valid.field_0.i[3] & uVar36;
                uVar27 = movmskps(iVar23,auVar58);
                uVar21 = CONCAT44((int)((ulong)local_1260 >> 0x20),uVar27);
                lVar30 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar130 = local_1158[lVar30];
                  fVar72 = local_1148[lVar30];
                  uVar27 = *(undefined4 *)(local_1128 + lVar30 * 4);
                  uVar5 = *(undefined4 *)(local_1118 + lVar30 * 4);
                  uVar6 = *(undefined4 *)(local_1108 + lVar30 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_1138[lVar30];
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar27;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar6;
                  *(float *)(ray + k * 4 + 0xf0) = fVar130;
                  *(float *)(ray + k * 4 + 0x100) = fVar72;
                  *(undefined4 *)(ray + k * 4 + 0x110) = (undefined4)uStack_12a0;
                  *(uint *)(ray + k * 4 + 0x120) = uVar26;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  root.ptr = (size_t)ray;
                }
                else {
                  local_12a8 = CONCAT44((undefined4)uStack_12a0,(undefined4)uStack_12a0);
                  uStack_12a0._4_4_ = (undefined4)uStack_12a0;
                  auVar91 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar19);
                  uStack_11bc = (undefined4)
                                ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar19 + 8) >> 0x20);
                  local_1258 = uVar24;
                  local_1248 = pGVar32;
                  local_1238 = fVar173;
                  fStack_1234 = fVar169;
                  fStack_1230 = fVar172;
                  fStack_122c = fVar189;
                  while( true ) {
                    local_1078 = local_1158[lVar30];
                    fVar130 = local_1148[lVar30];
                    *(float *)(ray + k * 4 + 0x80) = local_1138[lVar30];
                    args.context = context->user;
                    local_1068._4_4_ = fVar130;
                    local_1068._0_4_ = fVar130;
                    local_1068._8_4_ = fVar130;
                    local_1068._12_4_ = fVar130;
                    local_10a8 = *(undefined4 *)(local_1128 + lVar30 * 4);
                    uVar27 = *(undefined4 *)(local_1118 + lVar30 * 4);
                    uVar5 = *(undefined4 *)(local_1108 + lVar30 * 4);
                    local_1098._4_4_ = uVar27;
                    local_1098._0_4_ = uVar27;
                    local_1098._8_4_ = uVar27;
                    local_1098._12_4_ = uVar27;
                    local_1088._4_4_ = uVar5;
                    local_1088._0_4_ = uVar5;
                    local_1088._8_4_ = uVar5;
                    local_1088._12_4_ = uVar5;
                    uStack_10a4 = local_10a8;
                    uStack_10a0 = local_10a8;
                    uStack_109c = local_10a8;
                    fStack_1074 = local_1078;
                    fStack_1070 = local_1078;
                    fStack_106c = local_1078;
                    local_1058 = local_12a8;
                    uStack_1050 = uStack_12a0;
                    local_1048 = CONCAT44(uVar26,uVar26);
                    uStack_1040 = CONCAT44(uVar26,uVar26);
                    local_1038 = (args.context)->instID[0];
                    uStack_1034 = local_1038;
                    uStack_1030 = local_1038;
                    uStack_102c = local_1038;
                    local_1028 = (args.context)->instPrimID[0];
                    uStack_1024 = local_1028;
                    uStack_1020 = local_1028;
                    uStack_101c = local_1028;
                    local_1278._12_4_ = uStack_11bc;
                    local_1278._0_12_ = auVar91;
                    args.valid = (int *)local_1278;
                    args.geometryUserPtr = pGVar32->userPtr;
                    args.hit = (RTCHitN *)&local_10a8;
                    args.N = 4;
                    root.ptr = (size_t)ray;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar32->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar32->intersectionFilterN)(&args);
                      root.ptr = (size_t)extraout_RDX;
                      pGVar32 = local_1248;
                      fVar173 = local_1238;
                      fVar169 = fStack_1234;
                      fVar172 = fStack_1230;
                      fVar189 = fStack_122c;
                    }
                    if (local_1278 == (undefined1  [16])0x0) {
                      auVar83._8_4_ = 0xffffffff;
                      auVar83._0_8_ = 0xffffffffffffffff;
                      auVar83._12_4_ = 0xffffffff;
                      auVar83 = auVar83 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar32->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&args);
                        root.ptr = (size_t)extraout_RDX_00;
                        pGVar32 = local_1248;
                        fVar173 = local_1238;
                        fVar169 = fStack_1234;
                        fVar172 = fStack_1230;
                        fVar189 = fStack_122c;
                      }
                      auVar67._0_4_ = -(uint)(local_1278._0_4_ == 0);
                      auVar67._4_4_ = -(uint)(local_1278._4_4_ == 0);
                      auVar67._8_4_ = -(uint)(local_1278._8_4_ == 0);
                      auVar67._12_4_ = -(uint)(local_1278._12_4_ == 0);
                      auVar83 = auVar67 ^ _DAT_01f7ae20;
                      if (local_1278 != (undefined1  [16])0x0) {
                        auVar51 = blendvps(*(undefined1 (*) [16])args.hit,
                                           *(undefined1 (*) [16])(args.ray + 0xc0),auVar67);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar51;
                        auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                           *(undefined1 (*) [16])(args.ray + 0xd0),auVar67);
                        *(undefined1 (*) [16])(args.ray + 0xd0) = auVar51;
                        auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                           *(undefined1 (*) [16])(args.ray + 0xe0),auVar67);
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar51;
                        auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                           *(undefined1 (*) [16])(args.ray + 0xf0),auVar67);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar51;
                        auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                           *(undefined1 (*) [16])(args.ray + 0x100),auVar67);
                        *(undefined1 (*) [16])(args.ray + 0x100) = auVar51;
                        auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                           *(undefined1 (*) [16])(args.ray + 0x110),auVar67);
                        *(undefined1 (*) [16])(args.ray + 0x110) = auVar51;
                        auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                           *(undefined1 (*) [16])(args.ray + 0x120),auVar67);
                        *(undefined1 (*) [16])(args.ray + 0x120) = auVar51;
                        auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                           *(undefined1 (*) [16])(args.ray + 0x130),auVar67);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar51;
                        auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                           *(undefined1 (*) [16])(args.ray + 0x140),auVar67);
                        *(undefined1 (*) [16])(args.ray + 0x140) = auVar51;
                      }
                    }
                    if ((_DAT_01f7bb20 & auVar83) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar72;
                    }
                    else {
                      fVar72 = *(float *)(ray + k * 4 + 0x80);
                    }
                    *(undefined4 *)(local_1278 + lVar30 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(fVar173 <= fVar72) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(fVar169 <= fVar72) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(fVar172 <= fVar72) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(fVar189 <= fVar72) & valid.field_0.i[3];
                    iVar23 = movmskps(uVar18,(undefined1  [16])valid.field_0);
                    if (iVar23 == 0) break;
                    auVar15._4_4_ = fVar169;
                    auVar15._0_4_ = fVar173;
                    auVar15._8_4_ = fVar172;
                    auVar15._12_4_ = fVar189;
                    auVar126 = blendvps(_DAT_01f7a9f0,auVar15,(undefined1  [16])valid.field_0);
                    auVar120._4_4_ = auVar126._0_4_;
                    auVar120._0_4_ = auVar126._4_4_;
                    auVar120._8_4_ = auVar126._12_4_;
                    auVar120._12_4_ = auVar126._8_4_;
                    auVar51 = minps(auVar120,auVar126);
                    auVar84._0_8_ = auVar51._8_8_;
                    auVar84._8_4_ = auVar51._0_4_;
                    auVar84._12_4_ = auVar51._4_4_;
                    auVar51 = minps(auVar84,auVar51);
                    auVar85._0_8_ =
                         CONCAT44(-(uint)(auVar51._4_4_ == auVar126._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar51._0_4_ == auVar126._0_4_) & valid.field_0.i[0]);
                    auVar85._8_4_ = -(uint)(auVar51._8_4_ == auVar126._8_4_) & valid.field_0.i[2];
                    auVar85._12_4_ = -(uint)(auVar51._12_4_ == auVar126._12_4_) & valid.field_0.i[3]
                    ;
                    iVar23 = movmskps(iVar23,auVar85);
                    aVar68 = valid.field_0;
                    if (iVar23 != 0) {
                      aVar68.i[2] = auVar85._8_4_;
                      aVar68._0_8_ = auVar85._0_8_;
                      aVar68.i[3] = auVar85._12_4_;
                    }
                    uVar27 = movmskps(iVar23,(undefined1  [16])aVar68);
                    uVar21 = CONCAT44(uVar22,uVar27);
                    lVar30 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (2 < (uint)local_1218) {
          pGVar25 = local_1228 + uVar24 * 4 + 0x2c;
          pGVar4 = (local_1268->super_Precalculations).grid;
          uVar21 = (ulong)*(uint *)(pGVar4 + 0x14);
          pGVar28 = pGVar25 + uVar21 * 4;
          pGVar31 = pGVar25 + uVar21 * 8;
          fVar130 = *(float *)(local_1228 + uVar24 * 4 + 0x30);
          pGVar3 = pGVar25 + uVar24 * 4;
          fVar72 = *(float *)(pGVar3 + 4);
          if (uVar24 == 2) {
            fVar173 = *(float *)pGVar28;
            fVar169 = *(float *)(pGVar28 + 4);
            fVar172 = *(float *)(pGVar28 + 8);
            fVar189 = *(float *)(pGVar28 + 0xc);
            fVar194 = *(float *)pGVar31;
            fVar197 = *(float *)(pGVar31 + 4);
            fVar145 = *(float *)(pGVar31 + 8);
            fVar202 = *(float *)(pGVar31 + 0xc);
            fVar198 = fVar202;
            fVar206 = fVar130;
            fVar73 = fVar72;
            fVar152 = fVar189;
            fVar133 = fVar197;
            fVar143 = fVar169;
          }
          else {
            fVar173 = *(float *)pGVar28;
            fVar169 = *(float *)(pGVar28 + 4);
            pGVar1 = pGVar28 + uVar24 * 4;
            fVar172 = *(float *)pGVar1;
            fVar189 = *(float *)(pGVar1 + 4);
            fVar194 = *(float *)pGVar31;
            fVar197 = *(float *)(pGVar31 + 4);
            pGVar2 = pGVar31 + uVar24 * 4;
            fVar145 = *(float *)pGVar2;
            fVar202 = *(float *)(pGVar2 + 4);
            fVar198 = *(float *)(pGVar2 + 8);
            fVar206 = *(float *)(local_1228 + uVar24 * 4 + 0x34);
            fVar73 = *(float *)(pGVar3 + 8);
            fVar152 = *(float *)(pGVar1 + 8);
            fVar133 = *(float *)(pGVar31 + 8);
            fVar143 = *(float *)(pGVar28 + 8);
          }
          root.ptr = uVar21 * 0xc;
          local_1260 = pGVar25 + uVar21 * 0xc;
          local_1250 = local_1218;
          fVar185 = *(float *)(ray + k * 4);
          fVar188 = *(float *)(ray + k * 4 + 0x10);
          fVar90 = *(float *)(ray + k * 4 + 0x20);
          fVar195 = *(float *)(ray + k * 4 + 0x40);
          local_1238 = *(float *)pGVar25 - fVar185;
          fStack_1234 = *(float *)pGVar3 - fVar185;
          fStack_1230 = fVar130 - fVar185;
          fStack_122c = fVar72 - fVar185;
          fVar173 = fVar173 - fVar188;
          fVar183 = fVar172 - fVar188;
          fVar186 = fVar169 - fVar188;
          fVar190 = fVar189 - fVar188;
          fVar194 = fVar194 - fVar90;
          fVar192 = fVar145 - fVar90;
          fStack_1210 = fVar197 - fVar90;
          fStack_120c = fVar202 - fVar90;
          fVar200 = fVar130 - fVar185;
          fVar130 = fVar130 - fVar185;
          fVar201 = fVar206 - fVar185;
          fVar206 = fVar206 - fVar185;
          fVar153 = fVar169 - fVar188;
          fVar169 = fVar169 - fVar188;
          fVar158 = fVar143 - fVar188;
          fVar143 = fVar143 - fVar188;
          fVar134 = fVar197 - fVar90;
          fVar197 = fVar197 - fVar90;
          fVar141 = fVar133 - fVar90;
          fVar133 = fVar133 - fVar90;
          fVar40 = *(float *)pGVar3 - fVar185;
          fVar71 = fVar72 - fVar185;
          fVar72 = fVar72 - fVar185;
          fVar73 = fVar73 - fVar185;
          fVar172 = fVar172 - fVar188;
          fVar151 = fVar189 - fVar188;
          fVar189 = fVar189 - fVar188;
          fVar152 = fVar152 - fVar188;
          fVar145 = fVar145 - fVar90;
          fVar196 = fVar202 - fVar90;
          fVar202 = fVar202 - fVar90;
          fVar198 = fVar198 - fVar90;
          fVar163 = fVar40 - local_1238;
          fVar165 = fVar71 - fStack_1234;
          fStack_1220 = fVar72 - fStack_1230;
          fStack_121c = fVar73 - fStack_122c;
          fVar90 = fVar172 - fVar173;
          fVar103 = fVar151 - fVar183;
          fVar122 = fVar189 - fVar186;
          fVar199 = fVar152 - fVar190;
          fVar170 = fVar145 - fVar194;
          fVar171 = fVar196 - fVar192;
          fVar174 = fVar202 - fStack_1210;
          fVar181 = fVar198 - fStack_120c;
          fVar185 = *(float *)(ray + k * 4 + 0x50);
          fVar188 = *(float *)(ray + k * 4 + 0x60);
          fVar156 = local_1238 - fVar200;
          fVar157 = fStack_1234 - fVar130;
          fVar159 = fStack_1230 - fVar201;
          fVar160 = fStack_122c - fVar206;
          fVar131 = (fVar90 * (fVar145 + fVar194) - (fVar172 + fVar173) * fVar170) * fVar195 +
                    ((fVar40 + local_1238) * fVar170 - (fVar145 + fVar194) * fVar163) * fVar185 +
                    (fVar163 * (fVar172 + fVar173) - (fVar40 + local_1238) * fVar90) * fVar188;
          fVar132 = (fVar103 * (fVar196 + fVar192) - (fVar151 + fVar183) * fVar171) * fVar195 +
                    ((fVar71 + fStack_1234) * fVar171 - (fVar196 + fVar192) * fVar165) * fVar185 +
                    (fVar165 * (fVar151 + fVar183) - (fVar71 + fStack_1234) * fVar103) * fVar188;
          auVar128._0_8_ = CONCAT44(fVar132,fVar131);
          auVar128._8_4_ =
               (fVar122 * (fVar202 + fStack_1210) - (fVar189 + fVar186) * fVar174) * fVar195 +
               ((fVar72 + fStack_1230) * fVar174 - (fVar202 + fStack_1210) * fStack_1220) * fVar185
               + (fStack_1220 * (fVar189 + fVar186) - (fVar72 + fStack_1230) * fVar122) * fVar188;
          auVar128._12_4_ =
               (fVar199 * (fVar198 + fStack_120c) - (fVar152 + fVar190) * fVar181) * fVar195 +
               ((fVar73 + fStack_122c) * fVar181 - (fVar198 + fStack_120c) * fStack_121c) * fVar185
               + (fStack_121c * (fVar152 + fVar190) - (fVar73 + fStack_122c) * fVar199) * fVar188;
          fVar164 = fVar173 - fVar153;
          fVar166 = fVar183 - fVar169;
          fVar167 = fVar186 - fVar158;
          fVar168 = fVar190 - fVar143;
          fVar193 = fVar194 - fVar134;
          fVar105 = fVar192 - fVar197;
          fStack_1240 = fStack_1210 - fVar141;
          fStack_123c = fStack_120c - fVar133;
          local_1248 = (Geometry *)CONCAT44(fVar105,fVar193);
          local_10d8._0_4_ =
               (fVar164 * (fVar194 + fVar134) - (fVar173 + fVar153) * fVar193) * fVar195 +
               ((local_1238 + fVar200) * fVar193 - (fVar194 + fVar134) * fVar156) * fVar185 +
               (fVar156 * (fVar173 + fVar153) - (local_1238 + fVar200) * fVar164) * fVar188;
          local_10d8._4_4_ =
               (fVar166 * (fVar192 + fVar197) - (fVar183 + fVar169) * fVar105) * fVar195 +
               ((fStack_1234 + fVar130) * fVar105 - (fVar192 + fVar197) * fVar157) * fVar185 +
               (fVar157 * (fVar183 + fVar169) - (fStack_1234 + fVar130) * fVar166) * fVar188;
          fStack_10d0 = (fVar167 * (fStack_1210 + fVar141) - (fVar186 + fVar158) * fStack_1240) *
                        fVar195 + ((fStack_1230 + fVar201) * fStack_1240 -
                                  (fStack_1210 + fVar141) * fVar159) * fVar185 +
                                  (fVar159 * (fVar186 + fVar158) - (fStack_1230 + fVar201) * fVar167
                                  ) * fVar188;
          fStack_10cc = (fVar168 * (fStack_120c + fVar133) - (fVar190 + fVar143) * fStack_123c) *
                        fVar195 + ((fStack_122c + fVar206) * fStack_123c -
                                  (fStack_120c + fVar133) * fVar160) * fVar185 +
                                  (fVar160 * (fVar190 + fVar143) - (fStack_122c + fVar206) * fVar168
                                  ) * fVar188;
          fVar182 = fVar200 - fVar40;
          fVar184 = fVar130 - fVar71;
          fVar187 = fVar201 - fVar72;
          fVar191 = fVar206 - fVar73;
          local_10e8 = fVar153 - fVar172;
          fStack_10e4 = fVar169 - fVar151;
          fStack_10e0 = fVar158 - fVar189;
          fStack_10dc = fVar143 - fVar152;
          fVar135 = fVar134 - fVar145;
          fVar140 = fVar197 - fVar196;
          fVar142 = fVar141 - fVar202;
          fVar144 = fVar133 - fVar198;
          auVar80._0_4_ =
               (local_10e8 * (fVar145 + fVar134) - (fVar172 + fVar153) * fVar135) * fVar195 +
               ((fVar40 + fVar200) * fVar135 - (fVar145 + fVar134) * fVar182) * fVar185 +
               (fVar182 * (fVar172 + fVar153) - (fVar40 + fVar200) * local_10e8) * fVar188;
          auVar80._4_4_ =
               (fStack_10e4 * (fVar196 + fVar197) - (fVar151 + fVar169) * fVar140) * fVar195 +
               ((fVar71 + fVar130) * fVar140 - (fVar196 + fVar197) * fVar184) * fVar185 +
               (fVar184 * (fVar151 + fVar169) - (fVar71 + fVar130) * fStack_10e4) * fVar188;
          auVar80._8_4_ =
               (fStack_10e0 * (fVar202 + fVar141) - (fVar189 + fVar158) * fVar142) * fVar195 +
               ((fVar72 + fVar201) * fVar142 - (fVar202 + fVar141) * fVar187) * fVar185 +
               (fVar187 * (fVar189 + fVar158) - (fVar72 + fVar201) * fStack_10e0) * fVar188;
          auVar80._12_4_ =
               (fStack_10dc * (fVar198 + fVar133) - (fVar152 + fVar143) * fVar144) * fVar195 +
               ((fVar73 + fVar206) * fVar144 - (fVar198 + fVar133) * fVar191) * fVar185 +
               (fVar191 * (fVar152 + fVar143) - (fVar73 + fVar206) * fStack_10dc) * fVar188;
          auVar100._0_4_ = fVar131 + (float)local_10d8._0_4_ + auVar80._0_4_;
          auVar100._4_4_ = fVar132 + (float)local_10d8._4_4_ + auVar80._4_4_;
          auVar100._8_4_ = auVar128._8_4_ + fStack_10d0 + auVar80._8_4_;
          auVar100._12_4_ = auVar128._12_4_ + fStack_10cc + auVar80._12_4_;
          auVar59._8_4_ = auVar128._8_4_;
          auVar59._0_8_ = auVar128._0_8_;
          auVar59._12_4_ = auVar128._12_4_;
          auVar51 = minps(auVar59,_local_10d8);
          auVar126 = minps(auVar51,auVar80);
          auVar51 = maxps(auVar128,_local_10d8);
          auVar41 = maxps(auVar51,auVar80);
          fStack_10f0 = ABS(auVar100._8_4_);
          fStack_10ec = ABS(auVar100._12_4_);
          uVar21 = CONCAT44(auVar100._4_4_,auVar100._0_4_);
          local_10f8 = (undefined1  [8])(uVar21 & 0x7fffffff7fffffff);
          auVar51 = _local_10f8;
          auVar129._4_4_ = -(uint)(auVar41._4_4_ <= ABS(auVar100._4_4_) * 1.1920929e-07);
          auVar129._0_4_ = -(uint)(auVar41._0_4_ <= ABS(auVar100._0_4_) * 1.1920929e-07);
          auVar129._8_4_ = -(uint)(auVar41._8_4_ <= fStack_10f0 * 1.1920929e-07);
          auVar129._12_4_ = -(uint)(auVar41._12_4_ <= fStack_10ec * 1.1920929e-07);
          auVar60._4_4_ = -(uint)(-(ABS(auVar100._4_4_) * 1.1920929e-07) <= auVar126._4_4_);
          auVar60._0_4_ = -(uint)(-(ABS(auVar100._0_4_) * 1.1920929e-07) <= auVar126._0_4_);
          auVar60._8_4_ = -(uint)(-(fStack_10f0 * 1.1920929e-07) <= auVar126._8_4_);
          auVar60._12_4_ = -(uint)(-(fStack_10ec * 1.1920929e-07) <= auVar126._12_4_);
          auVar129 = auVar129 | auVar60;
          iVar23 = movmskps(uVar18,auVar129);
          if (iVar23 != 0) {
            auVar150._0_4_ = fVar90 * fVar193 - fVar164 * fVar170;
            auVar150._4_4_ = fVar103 * fVar105 - fVar166 * fVar171;
            auVar150._8_4_ = fVar122 * fStack_1240 - fVar167 * fVar174;
            auVar150._12_4_ = fVar199 * fStack_123c - fVar168 * fVar181;
            auVar162._0_4_ = fVar164 * fVar135 - local_10e8 * fVar193;
            auVar162._4_4_ = fVar166 * fVar140 - fStack_10e4 * fVar105;
            auVar162._8_4_ = fVar167 * fVar142 - fStack_10e0 * fStack_1240;
            auVar162._12_4_ = fVar168 * fVar144 - fStack_10dc * fStack_123c;
            auVar61._4_4_ = -(uint)(ABS(fVar166 * fVar171) < ABS(fStack_10e4 * fVar105));
            auVar61._0_4_ = -(uint)(ABS(fVar164 * fVar170) < ABS(local_10e8 * fVar193));
            auVar61._8_4_ = -(uint)(ABS(fVar167 * fVar174) < ABS(fStack_10e0 * fStack_1240));
            auVar61._12_4_ = -(uint)(ABS(fVar168 * fVar181) < ABS(fStack_10dc * fStack_123c));
            local_1128 = blendvps(auVar162,auVar150,auVar61);
            auVar178._0_4_ = fVar182 * fVar193 - fVar156 * fVar135;
            auVar178._4_4_ = fVar184 * fVar105 - fVar157 * fVar140;
            auVar178._8_4_ = fVar187 * fStack_1240 - fVar159 * fVar142;
            auVar178._12_4_ = fVar191 * fStack_123c - fVar160 * fVar144;
            auVar62._4_4_ = -(uint)(ABS(fVar165 * fVar105) < ABS(fVar157 * fVar140));
            auVar62._0_4_ = -(uint)(ABS(fVar163 * fVar193) < ABS(fVar156 * fVar135));
            auVar62._8_4_ = -(uint)(ABS(fStack_1220 * fStack_1240) < ABS(fVar159 * fVar142));
            auVar62._12_4_ = -(uint)(ABS(fStack_121c * fStack_123c) < ABS(fVar160 * fVar144));
            auVar11._4_4_ = fVar171 * fVar157 - fVar165 * fVar105;
            auVar11._0_4_ = fVar170 * fVar156 - fVar163 * fVar193;
            auVar11._8_4_ = fVar174 * fVar159 - fStack_1220 * fStack_1240;
            auVar11._12_4_ = fVar181 * fVar160 - fStack_121c * fStack_123c;
            local_1118 = blendvps(auVar178,auVar11,auVar62);
            auVar139._0_4_ = fVar163 * fVar164 - fVar156 * fVar90;
            auVar139._4_4_ = fVar165 * fVar166 - fVar157 * fVar103;
            auVar139._8_4_ = fStack_1220 * fVar167 - fVar159 * fVar122;
            auVar139._12_4_ = fStack_121c * fVar168 - fVar160 * fVar199;
            auVar155._0_4_ = fVar156 * local_10e8 - fVar182 * fVar164;
            auVar155._4_4_ = fVar157 * fStack_10e4 - fVar184 * fVar166;
            auVar155._8_4_ = fVar159 * fStack_10e0 - fVar187 * fVar167;
            auVar155._12_4_ = fVar160 * fStack_10dc - fVar191 * fVar168;
            auVar63._4_4_ = -(uint)(ABS(fVar157 * fVar103) < ABS(fVar184 * fVar166));
            auVar63._0_4_ = -(uint)(ABS(fVar156 * fVar90) < ABS(fVar182 * fVar164));
            auVar63._8_4_ = -(uint)(ABS(fVar159 * fVar122) < ABS(fVar187 * fVar167));
            auVar63._12_4_ = -(uint)(ABS(fVar160 * fVar199) < ABS(fVar191 * fVar168));
            local_1108 = blendvps(auVar155,auVar139,auVar63);
            fVar130 = fVar195 * local_1128._0_4_ +
                      fVar185 * local_1118._0_4_ + fVar188 * local_1108._0_4_;
            fVar72 = fVar195 * local_1128._4_4_ +
                     fVar185 * local_1118._4_4_ + fVar188 * local_1108._4_4_;
            fVar169 = fVar195 * local_1128._8_4_ +
                      fVar185 * local_1118._8_4_ + fVar188 * local_1108._8_4_;
            fVar172 = fVar195 * local_1128._12_4_ +
                      fVar185 * local_1118._12_4_ + fVar188 * local_1108._12_4_;
            auVar115._0_4_ = fVar130 + fVar130;
            auVar115._4_4_ = fVar72 + fVar72;
            auVar115._8_4_ = fVar169 + fVar169;
            auVar115._12_4_ = fVar172 + fVar172;
            auVar64._0_4_ = fVar173 * local_1118._0_4_ + fVar194 * local_1108._0_4_;
            auVar64._4_4_ = fVar183 * local_1118._4_4_ + fVar192 * local_1108._4_4_;
            auVar64._8_4_ = fVar186 * local_1118._8_4_ + fStack_1210 * local_1108._8_4_;
            auVar64._12_4_ = fVar190 * local_1118._12_4_ + fStack_120c * local_1108._12_4_;
            fVar172 = local_1238 * local_1128._0_4_ + auVar64._0_4_;
            fVar189 = fStack_1234 * local_1128._4_4_ + auVar64._4_4_;
            fVar145 = fStack_1230 * local_1128._8_4_ + auVar64._8_4_;
            fVar202 = fStack_122c * local_1128._12_4_ + auVar64._12_4_;
            auVar126 = rcpps(auVar64,auVar115);
            fVar130 = auVar126._0_4_;
            fVar72 = auVar126._4_4_;
            fVar173 = auVar126._8_4_;
            fVar169 = auVar126._12_4_;
            fVar172 = ((1.0 - auVar115._0_4_ * fVar130) * fVar130 + fVar130) * (fVar172 + fVar172);
            fVar189 = ((1.0 - auVar115._4_4_ * fVar72) * fVar72 + fVar72) * (fVar189 + fVar189);
            fVar173 = ((1.0 - auVar115._8_4_ * fVar173) * fVar173 + fVar173) * (fVar145 + fVar145);
            fVar169 = ((1.0 - auVar115._12_4_ * fVar169) * fVar169 + fVar169) * (fVar202 + fVar202);
            fVar72 = *(float *)(ray + k * 4 + 0x80);
            fVar130 = *(float *)(ray + k * 4 + 0x30);
            auVar65._0_4_ = -(uint)(fVar172 <= fVar72 && fVar130 <= fVar172) & auVar129._0_4_;
            auVar65._4_4_ = -(uint)(fVar189 <= fVar72 && fVar130 <= fVar189) & auVar129._4_4_;
            auVar65._8_4_ = -(uint)(fVar173 <= fVar72 && fVar130 <= fVar173) & auVar129._8_4_;
            auVar65._12_4_ = -(uint)(fVar169 <= fVar72 && fVar130 <= fVar169) & auVar129._12_4_;
            iVar23 = movmskps(uVar18,auVar65);
            if (iVar23 != 0) {
              auVar116._4_4_ = -(uint)(auVar115._4_4_ != 0.0);
              auVar116._0_4_ = -(uint)(auVar115._0_4_ != 0.0);
              auVar116._8_4_ = -(uint)(auVar115._8_4_ != 0.0);
              auVar116._12_4_ = -(uint)(auVar115._12_4_ != 0.0);
              valid.field_0.i[0] = auVar65._0_4_ & -(uint)(auVar115._0_4_ != 0.0);
              valid.field_0.i[1] = auVar65._4_4_ & -(uint)(auVar115._4_4_ != 0.0);
              valid.field_0.i[2] = auVar65._8_4_ & -(uint)(auVar115._8_4_ != 0.0);
              valid.field_0.i[3] = auVar65._12_4_ & -(uint)(auVar115._12_4_ != 0.0);
              iVar23 = movmskps(iVar23,(undefined1  [16])valid.field_0);
              if (iVar23 != 0) {
                uStack_12b0._0_4_ = *(uint *)(pGVar4 + 0x18);
                fVar130 = *(float *)(pGVar4 + 0x1c);
                uStack_12d0 = auVar128._8_8_;
                tNear.field_0._8_8_ = uStack_12d0;
                tNear.field_0._0_8_ = auVar128._0_8_;
                local_1138[0] = fVar172;
                local_1138[1] = fVar189;
                local_1138[2] = fVar173;
                local_1138[3] = fVar169;
                pGVar32 = (context->scene->geometries).items[(uint)uStack_12b0].ptr;
                root.ptr = (size_t)(ulong)*(uint *)(ray + k * 4 + 0x90);
                if ((pGVar32->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar126 = *(undefined1 (*) [16])local_1260;
                  auVar92 = auVar126._0_12_;
                  auVar41 = *(undefined1 (*) [16])(local_1260 + uVar24 * 4);
                  auVar76 = auVar41._0_12_;
                  if (uVar24 == 2) {
                    auVar92._0_8_ = auVar126._0_8_;
                    auVar92._8_4_ = auVar126._4_4_;
                    auVar76._0_8_ = auVar41._0_8_;
                    auVar76._8_4_ = auVar41._4_4_;
                  }
                  auVar126 = rcpps(auVar116,auVar100);
                  fVar145 = auVar126._0_4_;
                  fVar202 = auVar126._4_4_;
                  fVar194 = auVar126._8_4_;
                  fVar197 = auVar126._12_4_;
                  fVar145 = (float)(-(uint)(1e-18 <= (float)local_10f8._0_4_) &
                                   (uint)(((float)DAT_01f7ba10 - auVar100._0_4_ * fVar145) * fVar145
                                         + fVar145));
                  fVar202 = (float)(-(uint)(1e-18 <= (float)local_10f8._4_4_) &
                                   (uint)((DAT_01f7ba10._4_4_ - auVar100._4_4_ * fVar202) * fVar202
                                         + fVar202));
                  fVar194 = (float)(-(uint)(1e-18 <= fStack_10f0) &
                                   (uint)((DAT_01f7ba10._8_4_ - auVar100._8_4_ * fVar194) * fVar194
                                         + fVar194));
                  fVar197 = (float)(-(uint)(1e-18 <= fStack_10ec) &
                                   (uint)((DAT_01f7ba10._12_4_ - auVar100._12_4_ * fVar197) *
                                          fVar197 + fVar197));
                  auVar179._0_4_ = fVar131 * fVar145;
                  auVar179._4_4_ = fVar132 * fVar202;
                  auVar179._8_4_ = auVar128._8_4_ * fVar194;
                  auVar179._12_4_ = auVar128._12_4_ * fVar197;
                  auVar180 = minps(auVar179,_DAT_01f7ba10);
                  auVar148._0_4_ = (float)local_10d8._0_4_ * fVar145;
                  auVar148._4_4_ = (float)local_10d8._4_4_ * fVar202;
                  auVar148._8_4_ = fStack_10d0 * fVar194;
                  auVar148._12_4_ = fStack_10cc * fVar197;
                  auVar177 = minps(auVar148,_DAT_01f7ba10);
                  auVar101._4_4_ = auVar92._4_4_;
                  auVar118._0_8_ = auVar92._0_8_;
                  auVar101._8_4_ = auVar92._8_4_;
                  auVar118._8_4_ = auVar101._4_4_;
                  uVar74 = auVar76._4_4_;
                  auVar118._12_4_ = uVar74;
                  uVar26 = auVar76._0_4_;
                  auVar117._8_8_ = auVar118._8_8_;
                  auVar117._0_4_ = auVar92._0_4_;
                  auVar117._4_4_ = uVar26;
                  auVar101._0_4_ = auVar101._4_4_;
                  auVar101._12_4_ = auVar101._8_4_;
                  auVar81._0_8_ = auVar76._0_8_;
                  auVar81._8_4_ = uVar74;
                  auVar81._12_4_ = auVar76._8_4_;
                  auVar126 = ZEXT816(0);
                  auVar93 = pblendw(auVar117,auVar126,0xaa);
                  auVar41 = pblendw(auVar101,auVar126,0xaa);
                  auVar126 = pblendw(auVar81,auVar126,0xaa);
                  fVar133 = auVar180._0_4_;
                  fVar143 = auVar180._4_4_;
                  fVar185 = auVar180._8_4_;
                  fVar188 = auVar180._12_4_;
                  fVar198 = auVar177._0_4_;
                  fVar206 = auVar177._4_4_;
                  fVar73 = auVar177._8_4_;
                  fVar152 = auVar177._12_4_;
                  fVar145 = ((float)DAT_01f7ba10 - fVar133) - fVar198;
                  fVar202 = (DAT_01f7ba10._4_4_ - fVar143) - fVar206;
                  fVar194 = (DAT_01f7ba10._8_4_ - fVar185) - fVar73;
                  fVar197 = (DAT_01f7ba10._12_4_ - fVar188) - fVar152;
                  local_1158[0] =
                       (float)auVar93._0_4_ * 0.00012207031 * fVar145 +
                       (float)auVar126._0_4_ * 0.00012207031 * fVar198 +
                       (float)auVar41._0_4_ * 0.00012207031 * fVar133;
                  local_1158[1] =
                       (float)auVar93._4_4_ * 0.00012207031 * fVar202 +
                       (float)auVar126._4_4_ * 0.00012207031 * fVar206 +
                       (float)auVar41._4_4_ * 0.00012207031 * fVar143;
                  local_1158[2] =
                       (float)auVar93._8_4_ * 0.00012207031 * fVar194 +
                       (float)auVar126._8_4_ * 0.00012207031 * fVar73 +
                       (float)auVar41._8_4_ * 0.00012207031 * fVar185;
                  local_1158[3] =
                       (float)auVar93._12_4_ * 0.00012207031 * fVar197 +
                       (float)auVar126._12_4_ * 0.00012207031 * fVar152 +
                       (float)auVar41._12_4_ * 0.00012207031 * fVar188;
                  local_1148[0] =
                       fVar145 * (float)(auVar117._0_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar26 >> 0x10) * 0.00012207031 * fVar198 +
                       (float)(auVar101._4_4_ >> 0x10) * 0.00012207031 * fVar133;
                  local_1148[1] =
                       fVar202 * (float)(uVar26 >> 0x10) * 0.00012207031 +
                       (float)(uVar74 >> 0x10) * 0.00012207031 * fVar206 +
                       (float)(auVar101._4_4_ >> 0x10) * 0.00012207031 * fVar143;
                  local_1148[2] =
                       fVar194 * (float)(auVar101._4_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar74 >> 0x10) * 0.00012207031 * fVar73 +
                       (float)(auVar101._8_4_ >> 0x10) * 0.00012207031 * fVar185;
                  local_1148[3] =
                       fVar197 * (float)(uVar74 >> 0x10) * 0.00012207031 +
                       (float)(auVar76._8_4_ >> 0x10) * 0.00012207031 * fVar152 +
                       (float)(auVar101._8_4_ >> 0x10) * 0.00012207031 * fVar188;
                  auVar13._4_4_ = fVar189;
                  auVar13._0_4_ = fVar172;
                  auVar13._8_4_ = fVar173;
                  auVar13._12_4_ = fVar169;
                  auVar41 = blendvps(_DAT_01f7a9f0,auVar13,(undefined1  [16])valid.field_0);
                  auVar119._4_4_ = auVar41._0_4_;
                  auVar119._0_4_ = auVar41._4_4_;
                  auVar119._8_4_ = auVar41._12_4_;
                  auVar119._12_4_ = auVar41._8_4_;
                  auVar126 = minps(auVar119,auVar41);
                  auVar82._0_8_ = auVar126._8_8_;
                  auVar82._8_4_ = auVar126._0_4_;
                  auVar82._12_4_ = auVar126._4_4_;
                  auVar126 = minps(auVar82,auVar126);
                  uVar36 = -(uint)(auVar126._0_4_ == auVar41._0_4_);
                  uVar35 = -(uint)(auVar126._4_4_ == auVar41._4_4_);
                  uVar37 = -(uint)(auVar126._8_4_ == auVar41._8_4_);
                  uVar38 = -(uint)(auVar126._12_4_ == auVar41._12_4_);
                  auVar102._0_4_ = uVar36 & valid.field_0.i[0];
                  auVar102._4_4_ = uVar35 & valid.field_0.i[1];
                  auVar102._8_4_ = uVar37 & valid.field_0.i[2];
                  auVar102._12_4_ = uVar38 & valid.field_0.i[3];
                  iVar23 = movmskps((int)local_1260,auVar102);
                  uVar26 = 0xffffffff;
                  uVar74 = 0xffffffff;
                  uVar89 = 0xffffffff;
                  uVar104 = 0xffffffff;
                  if (iVar23 != 0) {
                    uVar26 = uVar36;
                    uVar74 = uVar35;
                    uVar89 = uVar37;
                    uVar104 = uVar38;
                  }
                  auVar66._0_4_ = valid.field_0.i[0] & uVar26;
                  auVar66._4_4_ = valid.field_0.i[1] & uVar74;
                  auVar66._8_4_ = valid.field_0.i[2] & uVar89;
                  auVar66._12_4_ = valid.field_0.i[3] & uVar104;
                  uVar27 = movmskps(iVar23,auVar66);
                  uVar21 = CONCAT44((int)((ulong)local_1260 >> 0x20),uVar27);
                  lVar30 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar32->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar72 = local_1158[lVar30];
                    fVar173 = local_1148[lVar30];
                    uVar18 = *(undefined4 *)(local_1128 + lVar30 * 4);
                    uVar22 = *(undefined4 *)(local_1118 + lVar30 * 4);
                    uVar27 = *(undefined4 *)(local_1108 + lVar30 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_1138[lVar30];
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar18;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar22;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar27;
                    *(float *)(ray + k * 4 + 0xf0) = fVar72;
                    *(float *)(ray + k * 4 + 0x100) = fVar173;
                    *(float *)(ray + k * 4 + 0x110) = fVar130;
                    *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_12b0;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    root.ptr = (size_t)ray;
                  }
                  else {
                    local_12b8 = CONCAT44((uint)uStack_12b0,(uint)uStack_12b0);
                    uStack_12b0._4_4_ = (uint)uStack_12b0;
                    local_1218 = (GridSOA *)CONCAT44(fVar130,fVar130);
                    uVar7 = *(undefined8 *)*(undefined1 (*) [12])(mm_lookupmask_ps + lVar19);
                    local_1228._0_4_ = (undefined4)uVar7;
                    local_1228._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
                    fStack_1220 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar19 + 8);
                    fStack_121c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar19 + 8) >>
                                         0x20);
                    local_1258 = uVar24;
                    fStack_1210 = fVar130;
                    fStack_120c = fVar130;
                    _local_10f8 = auVar51;
                    while( true ) {
                      local_1078 = local_1158[lVar30];
                      fVar130 = local_1148[lVar30];
                      *(float *)(ray + k * 4 + 0x80) = local_1138[lVar30];
                      args.context = context->user;
                      local_1068._4_4_ = fVar130;
                      local_1068._0_4_ = fVar130;
                      local_1068._8_4_ = fVar130;
                      local_1068._12_4_ = fVar130;
                      local_10a8 = *(undefined4 *)(local_1128 + lVar30 * 4);
                      uVar27 = *(undefined4 *)(local_1118 + lVar30 * 4);
                      uVar5 = *(undefined4 *)(local_1108 + lVar30 * 4);
                      local_1098._4_4_ = uVar27;
                      local_1098._0_4_ = uVar27;
                      local_1098._8_4_ = uVar27;
                      local_1098._12_4_ = uVar27;
                      local_1088._4_4_ = uVar5;
                      local_1088._0_4_ = uVar5;
                      local_1088._8_4_ = uVar5;
                      local_1088._12_4_ = uVar5;
                      uStack_10a4 = local_10a8;
                      uStack_10a0 = local_10a8;
                      uStack_109c = local_10a8;
                      fStack_1074 = local_1078;
                      fStack_1070 = local_1078;
                      fStack_106c = local_1078;
                      local_1058 = local_1218;
                      uStack_1050 = CONCAT44(fStack_120c,fStack_1210);
                      local_1048 = local_12b8;
                      uStack_1040 = uStack_12b0;
                      local_1038 = (args.context)->instID[0];
                      uStack_1034 = local_1038;
                      uStack_1030 = local_1038;
                      uStack_102c = local_1038;
                      local_1028 = (args.context)->instPrimID[0];
                      uStack_1024 = local_1028;
                      uStack_1020 = local_1028;
                      uStack_101c = local_1028;
                      local_1278._4_4_ = local_1228._4_4_;
                      local_1278._0_4_ = (undefined4)local_1228;
                      local_1278._8_4_ = fStack_1220;
                      local_1278._12_4_ = fStack_121c;
                      args.valid = (int *)local_1278;
                      args.geometryUserPtr = pGVar32->userPtr;
                      args.hit = (RTCHitN *)&local_10a8;
                      args.N = 4;
                      root.ptr = (size_t)ray;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar32->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar32->intersectionFilterN)(&args);
                        root.ptr = (size_t)extraout_RDX_01;
                      }
                      if (local_1278 == (undefined1  [16])0x0) {
                        auVar86._8_4_ = 0xffffffff;
                        auVar86._0_8_ = 0xffffffffffffffff;
                        auVar86._12_4_ = 0xffffffff;
                        auVar86 = auVar86 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar32->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var8)(&args);
                          root.ptr = (size_t)extraout_RDX_02;
                        }
                        auVar69._0_4_ = -(uint)(local_1278._0_4_ == 0);
                        auVar69._4_4_ = -(uint)(local_1278._4_4_ == 0);
                        auVar69._8_4_ = -(uint)(local_1278._8_4_ == 0);
                        auVar69._12_4_ = -(uint)(local_1278._12_4_ == 0);
                        auVar86 = auVar69 ^ _DAT_01f7ae20;
                        if (local_1278 != (undefined1  [16])0x0) {
                          auVar51 = blendvps(*(undefined1 (*) [16])args.hit,
                                             *(undefined1 (*) [16])(args.ray + 0xc0),auVar69);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar51;
                          auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                             *(undefined1 (*) [16])(args.ray + 0xd0),auVar69);
                          *(undefined1 (*) [16])(args.ray + 0xd0) = auVar51;
                          auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                             *(undefined1 (*) [16])(args.ray + 0xe0),auVar69);
                          *(undefined1 (*) [16])(args.ray + 0xe0) = auVar51;
                          auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                             *(undefined1 (*) [16])(args.ray + 0xf0),auVar69);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar51;
                          auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                             *(undefined1 (*) [16])(args.ray + 0x100),auVar69);
                          *(undefined1 (*) [16])(args.ray + 0x100) = auVar51;
                          auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                             *(undefined1 (*) [16])(args.ray + 0x110),auVar69);
                          *(undefined1 (*) [16])(args.ray + 0x110) = auVar51;
                          auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                             *(undefined1 (*) [16])(args.ray + 0x120),auVar69);
                          *(undefined1 (*) [16])(args.ray + 0x120) = auVar51;
                          auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                             *(undefined1 (*) [16])(args.ray + 0x130),auVar69);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar51;
                          auVar51 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                             *(undefined1 (*) [16])(args.ray + 0x140),auVar69);
                          *(undefined1 (*) [16])(args.ray + 0x140) = auVar51;
                        }
                      }
                      if ((_DAT_01f7bb20 & auVar86) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar72;
                      }
                      else {
                        fVar72 = *(float *)(ray + k * 4 + 0x80);
                      }
                      *(undefined4 *)(local_1278 + lVar30 * 4 + -0x10) = 0;
                      valid.field_0.i[0] = -(uint)(fVar172 <= fVar72) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(fVar189 <= fVar72) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(fVar173 <= fVar72) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(fVar169 <= fVar72) & valid.field_0.i[3];
                      iVar23 = movmskps(uVar18,(undefined1  [16])valid.field_0);
                      if (iVar23 == 0) break;
                      auVar14._4_4_ = fVar189;
                      auVar14._0_4_ = fVar172;
                      auVar14._8_4_ = fVar173;
                      auVar14._12_4_ = fVar169;
                      auVar126 = blendvps(_DAT_01f7a9f0,auVar14,(undefined1  [16])valid.field_0);
                      auVar121._4_4_ = auVar126._0_4_;
                      auVar121._0_4_ = auVar126._4_4_;
                      auVar121._8_4_ = auVar126._12_4_;
                      auVar121._12_4_ = auVar126._8_4_;
                      auVar51 = minps(auVar121,auVar126);
                      auVar87._0_8_ = auVar51._8_8_;
                      auVar87._8_4_ = auVar51._0_4_;
                      auVar87._12_4_ = auVar51._4_4_;
                      auVar51 = minps(auVar87,auVar51);
                      auVar88._0_8_ =
                           CONCAT44(-(uint)(auVar51._4_4_ == auVar126._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar51._0_4_ == auVar126._0_4_) & valid.field_0.i[0]);
                      auVar88._8_4_ = -(uint)(auVar51._8_4_ == auVar126._8_4_) & valid.field_0.i[2];
                      auVar88._12_4_ =
                           -(uint)(auVar51._12_4_ == auVar126._12_4_) & valid.field_0.i[3];
                      iVar23 = movmskps(iVar23,auVar88);
                      aVar70 = valid.field_0;
                      if (iVar23 != 0) {
                        aVar70.i[2] = auVar88._8_4_;
                        aVar70._0_8_ = auVar88._0_8_;
                        aVar70.i[3] = auVar88._12_4_;
                      }
                      uVar27 = movmskps(iVar23,(undefined1  [16])aVar70);
                      uVar24 = CONCAT44(uVar22,uVar27);
                      lVar30 = 0;
                      if (uVar24 != 0) {
                        for (; (uVar24 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        uVar18 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar126._4_4_ = uVar18;
        auVar126._0_4_ = uVar18;
        auVar126._8_4_ = uVar18;
        auVar126._12_4_ = uVar18;
        auVar51 = local_10c8;
        fVar198 = local_fa8;
        fVar206 = fStack_fa4;
        fVar73 = fStack_fa0;
        fVar130 = fStack_f9c;
        fVar152 = local_fd8;
        fVar133 = fStack_fd4;
        fVar143 = fStack_fd0;
        fVar169 = fStack_fcc;
        fVar185 = local_ff8;
        fVar188 = fStack_ff4;
        fVar90 = fStack_ff0;
        fVar189 = fStack_fec;
        fVar195 = local_1008;
        fVar40 = fStack_1004;
        fVar71 = fStack_1000;
        fVar193 = fStack_ffc;
        fVar103 = local_1018;
        fVar105 = fStack_1014;
        fVar122 = fStack_1010;
        fVar199 = fStack_100c;
        fVar145 = local_10b8;
        fVar202 = fStack_10b4;
        fVar194 = fStack_10b0;
        fVar197 = fStack_10ac;
        fVar131 = local_fb8;
        fVar132 = fStack_fb4;
        fVar134 = fStack_fb0;
        fVar72 = fStack_fac;
        fVar135 = local_fc8;
        fVar140 = fStack_fc4;
        fVar141 = fStack_fc0;
        fVar173 = fStack_fbc;
        fVar142 = local_fe8;
        fVar144 = fStack_fe4;
        fVar151 = fStack_fe0;
        fVar172 = fStack_fdc;
      }
      else {
        root.ptr = (ulong)pGVar28 & 0xfffffffffffffff0;
        sVar9 = *(size_t *)(root.ptr + (ulong)*(uint *)(root.ptr + 0x2c) + 0x30);
        (local_1268->super_Precalculations).grid = (GridSOA *)root.ptr;
        uVar18 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar126._4_4_ = uVar18;
        auVar126._0_4_ = uVar18;
        auVar126._8_4_ = uVar18;
        auVar126._12_4_ = uVar18;
        if (sVar9 != 0) {
          (pSVar20->ptr).ptr = sVar9;
          pSVar20->dist = 0;
          pSVar20 = pSVar20 + 1;
        }
      }
    }
    if (pSVar20 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }